

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sSpecialFloatTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles2::Stress::anon_unknown_0::RenderCase::drawTestPattern(RenderCase *this,bool useTexture)

{
  pointer *pppSVar1;
  size_type *__x;
  undefined1 *puVar2;
  int iVar3;
  RenderContext *pRVar4;
  code *pcVar5;
  TestLog *this_00;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  int i;
  int iVar10;
  uint uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  deUint32 err;
  RenderTarget *pRVar14;
  undefined4 extraout_var;
  void *__s;
  void *pvVar15;
  long lVar16;
  int y;
  long lVar17;
  Surface *pSVar18;
  int iVar19;
  void *__buf;
  void *__buf_00;
  int x;
  int iVar20;
  long lVar21;
  bool bVar22;
  undefined7 in_register_00000031;
  char *pcVar23;
  uint uVar24;
  byte bVar25;
  int x_1;
  char *pcVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  RGBA refColTexture;
  undefined4 uStack_404;
  size_type local_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  RGBA refColGradient;
  undefined4 uStack_3e4;
  size_type local_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  undefined1 local_3c8 [16];
  GLuint textureID;
  undefined4 uStack_3b4;
  undefined1 local_3b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  string *local_390;
  undefined1 local_388 [16];
  Surface resultImage;
  LogImageSet local_340;
  RGBA col;
  undefined4 uStack_2fc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  Surface errorMask;
  string local_2c8;
  string local_2a8;
  Vector<int,_4> res;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  _Alloc_hider local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258 [6];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f8;
  undefined1 local_1d8 [32];
  ShaderProgram patternProgram;
  
  if (Stress::(anonymous_namespace)::RenderCase::drawTestPattern(bool)::fullscreenQuad == '\0') {
    _GLOBAL__N_1::RenderCase::drawTestPattern();
  }
  pcVar26 = 
  "varying mediump vec4 v_position;\nvoid main ()\n{\n\tgl_FragColor = vec4((v_position.x + 1.0) * 0.5, 1.0, 1.0, 1.0);\n}\n"
  ;
  if (useTexture) {
    pcVar26 = 
    "uniform mediump sampler2D u_sampler;\nvarying mediump vec4 v_position;\nvoid main ()\n{\n\tgl_FragColor = texture2D(u_sampler, v_position.xy);\n}\n"
    ;
  }
  pRVar14 = Context::getRenderTarget((this->super_TestCase).m_context);
  bVar25 = 8 - (char)(pRVar14->m_pixelFormat).redBits;
  local_3c8._0_4_ = 0x100 << (8U - (char)(pRVar14->m_pixelFormat).greenBits & 0x1f);
  iVar20 = (pRVar14->m_pixelFormat).blueBits;
  tcu::Surface::Surface(&resultImage,0x100,0x100);
  tcu::Surface::Surface(&errorMask,0x100,0x100);
  patternProgram.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pppSVar1 = &patternProgram.m_shaders[0].
              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pppSVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pppSVar1,"Drawing a test pattern to detect ",0x21);
  pcVar23 = glcts::fixed_sample_locations_values + 1;
  if (useTexture) {
    pcVar23 = "texture sampling";
  }
  local_388._0_4_ = (int)CONCAT71(in_register_00000031,useTexture);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pppSVar1,pcVar23,(ulong)useTexture << 4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pppSVar1," side-effects.",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&patternProgram,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppSVar1);
  std::ios_base::~ios_base((ios_base *)(patternProgram.m_shaders + 5));
  iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar16 = CONCAT44(extraout_var,iVar10);
  pRVar4 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_1d8[0x10] = 0;
  local_1d8._17_8_ = 0;
  local_1d8._0_8_ = (pointer)0x0;
  local_1d8[8] = 0;
  local_1d8._9_7_ = 0;
  memset(&res,0,0xac);
  _refColTexture = (pointer)&local_3f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&refColTexture,
             "attribute highp vec4 a_pos;\nvarying mediump vec4 v_position;\nvoid main ()\n{\n\tv_position = a_pos;\n\tgl_Position = a_pos;\n}\n"
             ,"");
  __x = &local_340.m_name._M_string_length;
  local_340.m_name._M_dataplus._M_p =
       (pointer)((ulong)local_340.m_name._M_dataplus._M_p._4_4_ << 0x20);
  puVar2 = (undefined1 *)((long)&local_340.m_name.field_2 + 8);
  local_340.m_name._M_string_length = (size_type)puVar2;
  std::__cxx11::string::_M_construct<char*>((string *)__x,_refColTexture,_refColTexture + local_400)
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&res + ((ulong)local_340.m_name._M_dataplus._M_p & 0xffffffff) * 0x18),
              (value_type *)__x);
  _refColGradient = (pointer)&local_3d8;
  pcVar23 = pcVar26 + 0x73;
  if (local_388[0] != '\0') {
    pcVar23 = pcVar26 + 0x8c;
  }
  local_390 = (string *)&refColGradient;
  std::__cxx11::string::_M_construct<char_const*>(local_390,pcVar26,pcVar23);
  textureID = 1;
  local_3b0._0_8_ = &local_3a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b0,_refColGradient,_refColGradient + local_3e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&res + ((ulong)_textureID & 0xffffffff) * 0x18),(value_type *)local_3b0);
  glu::ShaderProgram::ShaderProgram(&patternProgram,pRVar4,(ProgramSources *)&res);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._0_8_ != &local_3a0) {
    operator_delete((void *)local_3b0._0_8_,local_3a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_refColGradient != &local_3d8) {
    operator_delete(_refColGradient,local_3d8._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_340.m_name._M_string_length != puVar2) {
    operator_delete((void *)local_340.m_name._M_string_length,local_340.m_name.field_2._8_8_ + 1);
  }
  local_3c8._0_4_ = local_3c8._0_4_ | 1 << (bVar25 & 0x1f);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_refColTexture != &local_3f8) {
    operator_delete(_refColTexture,local_3f8._M_allocated_capacity + 1);
  }
  uVar11 = 0x10000 << (8U - (char)iVar20 & 0x1f) | local_3c8._0_4_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1d8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1f8);
  lVar21 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)res.m_data + lVar21));
    lVar21 = lVar21 + -0x18;
  } while (lVar21 != -0x18);
  uVar12 = (**(code **)(lVar16 + 0x780))(patternProgram.m_program.m_program);
  _textureID = _textureID & 0xffffffff00000000;
  if (local_388[0] != '\0') {
    __s = operator_new(0x1000);
    lVar21 = 0;
    memset(__s,0,0x1000);
    pvVar15 = __s;
    do {
      fVar28 = (float)(int)lVar21 * 0.03125 + -0.5;
      fVar27 = -fVar28;
      if (-fVar28 <= fVar28) {
        fVar27 = fVar28;
      }
      lVar17 = 0;
      do {
        fVar29 = (float)(int)lVar17 * 0.03125 + -0.5;
        fVar28 = -fVar29;
        if (-fVar29 <= fVar29) {
          fVar28 = fVar29;
        }
        fVar29 = fVar28 * 255.0 + fVar27 * 255.0;
        fVar28 = 255.0;
        if (fVar29 <= 255.0) {
          fVar28 = fVar29;
        }
        *(uint *)((long)pvVar15 + lVar17 * 4) =
             (int)(float)(~-(uint)(fVar29 < 0.0) & (uint)fVar28) | 0xffffff00;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 0x20);
      lVar21 = lVar21 + 1;
      pvVar15 = (void *)((long)pvVar15 + 0x80);
    } while (lVar21 != 0x20);
    (**(code **)(lVar16 + 0x6f8))(1,&textureID);
    (**(code **)(lVar16 + 0xb8))(0xde1,(ulong)_textureID & 0xffffffff);
    (**(code **)(lVar16 + 0x1310))(0xde1,0,0x1908,0x20,0x20,0,0x1908,0x1401,__s);
    (**(code **)(lVar16 + 0x1360))(0xde1,0x2800,0x2601);
    (**(code **)(lVar16 + 0x1360))(0xde1,0x2801,0x2601);
    operator_delete(__s,0x1000);
  }
  (**(code **)(lVar16 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar16 + 0x188))(0x4000);
  (**(code **)(lVar16 + 0x1a00))(0,0,0x100,0x100);
  (**(code **)(lVar16 + 0x1680))(patternProgram.m_program.m_program);
  if (local_388[0] != '\0') {
    pcVar5 = *(code **)(lVar16 + 0x14f0);
    uVar13 = (**(code **)(lVar16 + 0xb48))(patternProgram.m_program.m_program,"u_sampler");
    (*pcVar5)(uVar13,0);
  }
  (**(code **)(lVar16 + 0x19f0))(uVar12,4,0x1406,0,0,drawTestPattern::fullscreenQuad);
  (**(code **)(lVar16 + 0x610))(uVar12);
  (**(code **)(lVar16 + 0x538))(5,0,4);
  (**(code **)(lVar16 + 0x518))(uVar12);
  (**(code **)(lVar16 + 0x1680))(0);
  (**(code **)(lVar16 + 0x648))();
  err = (**(code **)(lVar16 + 0x800))();
  glu::checkError(err,"RenderCase::drawTestPattern",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/stress/es2sSpecialFloatTests.cpp"
                  ,299);
  if (textureID != 0) {
    (**(code **)(lVar16 + 0x480))(1,&textureID);
  }
  pRVar4 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_340.m_name._M_dataplus._M_p = (char *)0x300000008;
  if (resultImage.m_pixels.m_cap != 0) {
    resultImage.m_pixels.m_cap = (size_t)resultImage.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&res,(TextureFormat *)&local_340,resultImage.m_width,
             resultImage.m_height,1,(void *)resultImage.m_pixels.m_cap);
  auVar9 = local_388;
  iVar20 = 0;
  glu::readPixels(pRVar4,0,0,(PixelBufferAccess *)&res);
  glu::ShaderProgram::~ShaderProgram(&patternProgram);
  if (auVar9[0] != '\0') {
    local_390 = (string *)&refColTexture;
  }
  uVar24 = (uint)local_3c8._0_4_ >> 8;
  bVar22 = false;
  do {
    fVar27 = ((float)iVar20 + (float)iVar20) * 0.00390625;
    local_3c8 = ZEXT416((uint)fVar27);
    fVar27 = floorf(fVar27);
    fVar28 = ((float)local_3c8._0_4_ - fVar27) + -0.5;
    fVar27 = -fVar28;
    if (-fVar28 <= fVar28) {
      fVar27 = fVar28;
    }
    iVar10 = 0;
    do {
      fVar28 = (float)iVar10;
      local_3c8._0_4_ = fVar28;
      fVar28 = (fVar28 + fVar28) * 0.00390625;
      local_388 = ZEXT416((uint)fVar28);
      fVar28 = floorf(fVar28);
      fVar29 = ((float)local_388._0_4_ - fVar28) + -0.5;
      fVar28 = -fVar29;
      if (-fVar29 <= fVar29) {
        fVar28 = fVar29;
      }
      fVar29 = fVar28 * 255.0 + fVar27 * 255.0;
      fVar28 = 255.0;
      if (fVar29 <= 255.0) {
        fVar28 = fVar29;
      }
      _refColTexture =
           (pointer)(CONCAT44(uStack_404,(int)(float)(~-(uint)(fVar29 < 0.0) & (uint)fVar28)) |
                    0xffffff00);
      _refColGradient =
           (pointer)(CONCAT44(uStack_3e4,(int)((float)local_3c8._0_4_ * 0.00390625 * 255.0)) |
                    0xffffff00);
      col.m_value = *(undefined4 *)
                     ((long)resultImage.m_pixels.m_ptr +
                     (long)(resultImage.m_width * iVar20 + iVar10) * 4);
      tcu::RGBA::toIVec((RGBA *)&local_340);
      tcu::RGBA::toIVec((RGBA *)&textureID);
      res.m_data[0] = 0;
      res.m_data[1] = 0;
      res.m_data[2] = 0;
      res.m_data[3] = 0;
      lVar16 = 0;
      do {
        res.m_data[lVar16] =
             *(int *)((long)&local_340.m_name._M_dataplus._M_p + lVar16 * 4) - (&textureID)[lVar16];
        lVar16 = lVar16 + 1;
      } while (lVar16 != 4);
      patternProgram.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      patternProgram.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      lVar16 = 0;
      do {
        iVar3 = res.m_data[lVar16];
        iVar19 = -iVar3;
        if (0 < iVar3) {
          iVar19 = iVar3;
        }
        *(int *)((long)&patternProgram.m_shaders[0].
                        super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar16 * 4) = iVar19;
        lVar16 = lVar16 + 1;
      } while (lVar16 != 4);
      bVar6 = (int)((1 << (bVar25 & 0x1f) & 0xffU) + 10) <
              (int)patternProgram.m_shaders[0].
                   super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
      bVar7 = (int)((uVar24 & 0xff) + 10) <
              patternProgram.m_shaders[0].
              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
              super__Vector_impl_data._M_start._4_4_;
      bVar8 = (int)((uVar11 >> 0x10 & 0xff) + 10) <
              (int)patternProgram.m_shaders[0].
                   super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      uVar12 = 0xff00ff00;
      if (bVar8 || (bVar7 || bVar6)) {
        uVar12 = 0xff0000ff;
      }
      if (bVar8 || (bVar7 || bVar6)) {
        bVar22 = true;
      }
      *(undefined4 *)
       ((long)errorMask.m_pixels.m_ptr + (long)(errorMask.m_width * iVar20 + iVar10) * 4) = uVar12;
      iVar10 = iVar10 + 1;
    } while (iVar10 != 0x100);
    iVar20 = iVar20 + 1;
  } while (iVar20 != 0x100);
  if (bVar22) {
    patternProgram.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    pppSVar1 = &patternProgram.m_shaders[0].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pppSVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pppSVar1,"Test pattern has missing/invalid pixels",0x27);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&patternProgram,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppSVar1);
    std::ios_base::~ios_base((ios_base *)(patternProgram.m_shaders + 5));
    this_00 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    _textureID = local_3b0 + 8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&textureID,"Results","");
    _refColTexture = (pointer)&local_3f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&refColTexture,"Result verification","");
    tcu::LogImageSet::LogImageSet(&local_340,(string *)&textureID,(string *)&refColTexture);
    tcu::TestLog::startImageSet
              (this_00,local_340.m_name._M_dataplus._M_p,local_340.m_description._M_dataplus._M_p);
    _refColGradient = (pointer)&local_3d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&refColGradient,"Result","");
    _col = (pointer)&local_2f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&col,"Result","");
    pSVar18 = &resultImage;
    tcu::LogImage::LogImage
              ((LogImage *)&patternProgram,(string *)&refColGradient,(string *)&col,pSVar18,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&patternProgram,(int)this_00,__buf,(size_t)pSVar18);
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"Error mask","");
    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"Error mask","");
    pSVar18 = &errorMask;
    tcu::LogImage::LogImage
              ((LogImage *)&res,&local_2a8,&local_2c8,pSVar18,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&res,(int)this_00,__buf_00,(size_t)pSVar18);
    tcu::TestLog::endImageSet(this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_p != local_258) {
      operator_delete(local_268._M_p,(ulong)(local_258[0]._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)res.m_data._0_8_ != &local_278) {
      operator_delete((void *)res.m_data._0_8_,(ulong)(local_278._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    if ((vector<glu::Shader_*,_std::allocator<glu::Shader_*>_> *)
        patternProgram.m_shaders[1].
        super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
        super__Vector_impl_data._M_finish != patternProgram.m_shaders + 2) {
      operator_delete(patternProgram.m_shaders[1].
                      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                      super__Vector_impl_data._M_finish,
                      (long)patternProgram.m_shaders[2].
                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                            _M_impl.super__Vector_impl_data._M_start + 1);
    }
    if (patternProgram.m_shaders[0].
        super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pointer)&patternProgram.m_shaders[0].
                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
      operator_delete(patternProgram.m_shaders[0].
                      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)patternProgram.m_shaders[0].
                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_col != &local_2f0) {
      operator_delete(_col,local_2f0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_refColGradient != &local_3d8) {
      operator_delete(_refColGradient,local_3d8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340.m_description._M_dataplus._M_p != &local_340.m_description.field_2) {
      operator_delete(local_340.m_description._M_dataplus._M_p,
                      local_340.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340.m_name._M_dataplus._M_p != &local_340.m_name.field_2) {
      operator_delete(local_340.m_name._M_dataplus._M_p,
                      local_340.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_refColTexture != &local_3f8) {
      operator_delete(_refColTexture,local_3f8._M_allocated_capacity + 1);
    }
    if (_textureID != local_3b0 + 8) {
      operator_delete(_textureID,local_3b0._8_8_ + 1);
    }
  }
  else {
    patternProgram.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    pppSVar1 = &patternProgram.m_shaders[0].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pppSVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pppSVar1,"No side-effects found.",0x16);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&patternProgram,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppSVar1);
    std::ios_base::~ios_base((ios_base *)(patternProgram.m_shaders + 5));
  }
  tcu::Surface::~Surface(&errorMask);
  tcu::Surface::~Surface(&resultImage);
  return (bool)(~bVar22 & 1);
}

Assistant:

bool RenderCase::drawTestPattern (bool useTexture)
{
	static const tcu::Vec4 fullscreenQuad[4] =
	{
		tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f),
		tcu::Vec4(-1.0f,  1.0f, 0.0f, 1.0f),
		tcu::Vec4( 1.0f, -1.0f, 0.0f, 1.0f),
		tcu::Vec4( 1.0f,  1.0f, 0.0f, 1.0f),
	};
	const char* const	vertexSource		=	"attribute highp vec4 a_pos;\n"
												"varying mediump vec4 v_position;\n"
												"void main ()\n"
												"{\n"
												"	v_position = a_pos;\n"
												"	gl_Position = a_pos;\n"
												"}\n";
	const char* const	fragmentSourceNoTex	=	"varying mediump vec4 v_position;\n"
												"void main ()\n"
												"{\n"
												"	gl_FragColor = vec4((v_position.x + 1.0) * 0.5, 1.0, 1.0, 1.0);\n"
												"}\n";
	const char* const	fragmentSourceTex	=	"uniform mediump sampler2D u_sampler;\n"
												"varying mediump vec4 v_position;\n"
												"void main ()\n"
												"{\n"
												"	gl_FragColor = texture2D(u_sampler, v_position.xy);\n"
												"}\n";
	const char* const	fragmentSource		=	(useTexture) ? (fragmentSourceTex) : (fragmentSourceNoTex);
	const tcu::RGBA		formatThreshold		= m_context.getRenderTarget().getPixelFormat().getColorThreshold();

	tcu::Surface		resultImage			(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	tcu::Surface		errorMask			(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	bool				error				=	false;

	m_testCtx.getLog() << tcu::TestLog::Message << "Drawing a test pattern to detect " << ((useTexture) ? ("texture sampling") : ("")) << " side-effects." << tcu::TestLog::EndMessage;

	// draw pattern
	{
		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const glu::ShaderProgram	patternProgram	(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(vertexSource) << glu::FragmentSource(fragmentSource));
		const GLint					positionLoc		= gl.getAttribLocation(patternProgram.getProgram(), "a_pos");
		GLuint						textureID		= 0;

		if (useTexture)
		{
			const int textureSize = 32;
			std::vector<tcu::Vector<deUint8, 4> > buffer(textureSize*textureSize);

			for (int x = 0; x < textureSize; ++x)
			for (int y = 0; y < textureSize; ++y)
			{
				// sum of two axis aligned gradients. Each gradient is 127 at the edges and 0 at the center.
				// pattern is symmetric (x and y) => no discontinuity near boundary => no need to worry of results with LINEAR filtering near boundaries
				const deUint8 redComponent = (deUint8)de::clamp(de::abs((float)x / (float)textureSize - 0.5f) * 255.0f + de::abs((float)y / (float)textureSize - 0.5f) * 255.0f, 0.0f, 255.0f);

				buffer[x * textureSize + y] = tcu::Vector<deUint8, 4>(redComponent, 255, 255, 255);
			}

			gl.genTextures(1, &textureID);
			gl.bindTexture(GL_TEXTURE_2D, textureID);
			gl.texImage2D(GL_TEXTURE_2D, 0, GL_RGBA, textureSize, textureSize, 0, GL_RGBA, GL_UNSIGNED_BYTE, buffer[0].getPtr());
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		}

		gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		gl.viewport(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		gl.useProgram(patternProgram.getProgram());

		if (useTexture)
			gl.uniform1i(gl.getUniformLocation(patternProgram.getProgram(), "u_sampler"), 0);

		gl.vertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, &fullscreenQuad[0]);

		gl.enableVertexAttribArray(positionLoc);
		gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);
		gl.disableVertexAttribArray(positionLoc);

		gl.useProgram(0);
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "RenderCase::drawTestPattern");

		if (textureID)
			gl.deleteTextures(1, &textureID);

		glu::readPixels(m_context.getRenderContext(), 0, 0, resultImage.getAccess());
	}

	// verify pattern
	for (int y = 0; y < TEST_CANVAS_SIZE; ++y)
	for (int x = 0; x < TEST_CANVAS_SIZE; ++x)
	{
		const float			texGradientPosX = deFloatFrac((float)x * 2.0f / (float)TEST_CANVAS_SIZE);
		const float			texGradientPosY = deFloatFrac((float)y * 2.0f / (float)TEST_CANVAS_SIZE);
		const deUint8		texRedComponent = (deUint8)de::clamp(de::abs(texGradientPosX - 0.5f) * 255.0f + de::abs(texGradientPosY - 0.5f) * 255.0f, 0.0f, 255.0f);

		const tcu::RGBA		refColTexture	= tcu::RGBA(texRedComponent, 255, 255, 255);
		const tcu::RGBA		refColGradient	= tcu::RGBA((int)((float)x / (float)TEST_CANVAS_SIZE * 255.0f), 255, 255, 255);
		const tcu::RGBA&	refCol			= (useTexture) ? (refColTexture) : (refColGradient);

		const int			colorThreshold	= 10;
		const tcu::RGBA		col				= resultImage.getPixel(x, y);
		const tcu::IVec4	colorDiff		= tcu::abs(col.toIVec() - refCol.toIVec());

		if (colorDiff.x() > formatThreshold.getRed()   + colorThreshold ||
			colorDiff.y() > formatThreshold.getGreen() + colorThreshold ||
			colorDiff.z() > formatThreshold.getBlue()  + colorThreshold)
		{
			errorMask.setPixel(x, y, tcu::RGBA::red());
			error = true;
		}
		else
			errorMask.setPixel(x, y, tcu::RGBA::green());
	}

	// report error
	if (error)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Test pattern has missing/invalid pixels" << tcu::TestLog::EndMessage;
		m_testCtx.getLog()
			<< tcu::TestLog::ImageSet("Results", "Result verification")
			<< tcu::TestLog::Image("Result",		"Result",		resultImage)
			<< tcu::TestLog::Image("Error mask",	"Error mask",	errorMask)
			<< tcu::TestLog::EndImageSet;
	}
	else
		m_testCtx.getLog() << tcu::TestLog::Message << "No side-effects found." << tcu::TestLog::EndMessage;

	return !error;
}